

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.hpp
# Opt level: O2

string * __thiscall
VolumeFile::normalizeFilePath(string *__return_storage_ptr__,VolumeFile *this,string *path)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string normalizeFilePath(const std::string& path) const
	{
		return path;
	}